

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall QDataWidgetMapper::setCurrentModelIndex(QDataWidgetMapper *this,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  long lVar2;
  char cVar3;
  QModelIndex *pQVar4;
  long in_FS_OFFSET;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((-1 < index->r) && (-1 < index->c)) &&
      (pQVar1 = (index->m).ptr, pQVar1 != (QAbstractItemModel *)0x0)) &&
     (lVar2 = *(long *)(this + 8), pQVar1 == *(QAbstractItemModel **)(lVar2 + 0x78))) {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_40,pQVar1,index);
    cVar3 = comparesEqual((QPersistentModelIndex *)(lVar2 + 0x90),&local_40);
    if (cVar3 != '\0') {
      pQVar4 = (QModelIndex *)&index->c;
      if (*(int *)(lVar2 + 0x88) == 1) {
        pQVar4 = index;
      }
      (**(code **)(*(long *)this + 0x60))(this,pQVar4->r);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setCurrentModelIndex(const QModelIndex &index)
{
    Q_D(QDataWidgetMapper);

    if (!index.isValid()
        || index.model() != d->model
        || index.parent() != d->rootIndex)
        return;

    setCurrentIndex(d->orientation == Qt::Horizontal ? index.row() : index.column());
}